

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool GetScriptOp(const_iterator *pc,const_iterator end,opcodetype *opcodeRet,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *pvchRet)

{
  long lVar1;
  const_iterator b;
  const_iterator b_00;
  const_iterator b_01;
  const_iterator b_02;
  const_iterator b_03;
  const_iterator __first;
  bool bVar2;
  uint16_t uVar3;
  difference_type dVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  const_iterator cVar9;
  const_iterator *in_RCX;
  uint *in_RDX;
  long in_FS_OFFSET;
  uint nSize;
  uint opcode;
  undefined4 in_stack_ffffffffffffff28;
  size_type in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff34;
  const_iterator in_stack_ffffffffffffff38;
  bool local_91;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = 0xff;
  if (in_RCX != (const_iterator *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator>=
                    ((const_iterator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                     ,in_stack_ffffffffffffff38);
  if (bVar2) {
    local_91 = false;
  }
  else {
    cVar9.ptr._4_4_ = in_stack_ffffffffffffff34;
    cVar9.ptr._0_4_ = in_stack_ffffffffffffff30;
    dVar4 = operator-(in_stack_ffffffffffffff38,cVar9);
    if (dVar4 < 1) {
      local_91 = false;
    }
    else {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff2c);
      pbVar8 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                         ((const_iterator *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      uVar5 = (uint)*pbVar8;
      if (uVar5 < 0x4f) {
        uVar6 = uVar5;
        if (0x4b < uVar5) {
          if (uVar5 == 0x4c) {
            b.ptr._4_4_ = in_stack_ffffffffffffff34;
            b.ptr._0_4_ = in_stack_ffffffffffffff30;
            dVar4 = operator-(in_stack_ffffffffffffff38,b);
            if (dVar4 < 1) {
              local_91 = false;
              goto LAB_00221db8;
            }
            prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator++
                      ((const_iterator *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
            pbVar8 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                               ((const_iterator *)
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            uVar6 = (uint)*pbVar8;
          }
          else if (uVar5 == 0x4d) {
            b_00.ptr._4_4_ = in_stack_ffffffffffffff34;
            b_00.ptr._0_4_ = in_stack_ffffffffffffff30;
            dVar4 = operator-(in_stack_ffffffffffffff38,b_00);
            if (dVar4 < 2) {
              local_91 = false;
              goto LAB_00221db8;
            }
            prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator[]
                      ((const_iterator *)in_stack_ffffffffffffff38.ptr,in_stack_ffffffffffffff34);
            uVar3 = ReadLE16((uchar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))
            ;
            uVar6 = (uint)uVar3;
            prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+=
                      ((const_iterator *)in_stack_ffffffffffffff38.ptr,in_stack_ffffffffffffff34);
          }
          else {
            uVar6 = 0;
            if (uVar5 == 0x4e) {
              b_01.ptr._4_4_ = in_stack_ffffffffffffff34;
              b_01.ptr._0_4_ = in_stack_ffffffffffffff30;
              dVar4 = operator-(in_stack_ffffffffffffff38,b_01);
              if (dVar4 < 4) {
                local_91 = false;
                goto LAB_00221db8;
              }
              prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator[]
                        ((const_iterator *)in_stack_ffffffffffffff38.ptr,in_stack_ffffffffffffff34);
              uVar6 = ReadLE32((uchar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ));
              prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+=
                        ((const_iterator *)in_stack_ffffffffffffff38.ptr,in_stack_ffffffffffffff34);
            }
          }
        }
        b_02.ptr._4_4_ = in_stack_ffffffffffffff34;
        b_02.ptr._0_4_ = in_stack_ffffffffffffff30;
        dVar4 = operator-(in_stack_ffffffffffffff38,b_02);
        if ((dVar4 < 0) ||
           (b_03.ptr._4_4_ = in_stack_ffffffffffffff34, b_03.ptr._0_4_ = in_stack_ffffffffffffff30,
           uVar7 = operator-(in_stack_ffffffffffffff38,b_03), uVar7 < uVar6)) {
          local_91 = false;
          goto LAB_00221db8;
        }
        if (in_RCX != (const_iterator *)0x0) {
          cVar9 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                            ((const_iterator *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff2c);
          __first.ptr._4_4_ = uVar5;
          __first.ptr._0_4_ = uVar6;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          assign<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),__first,cVar9);
          in_stack_ffffffffffffff38.ptr = (uchar *)in_RCX;
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+=
                  ((const_iterator *)in_stack_ffffffffffffff38.ptr,in_stack_ffffffffffffff34);
      }
      *in_RDX = uVar5;
      local_91 = true;
    }
  }
LAB_00221db8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool GetScriptOp(CScriptBase::const_iterator& pc, CScriptBase::const_iterator end, opcodetype& opcodeRet, std::vector<unsigned char>* pvchRet)
{
    opcodeRet = OP_INVALIDOPCODE;
    if (pvchRet)
        pvchRet->clear();
    if (pc >= end)
        return false;

    // Read instruction
    if (end - pc < 1)
        return false;
    unsigned int opcode = *pc++;

    // Immediate operand
    if (opcode <= OP_PUSHDATA4)
    {
        unsigned int nSize = 0;
        if (opcode < OP_PUSHDATA1)
        {
            nSize = opcode;
        }
        else if (opcode == OP_PUSHDATA1)
        {
            if (end - pc < 1)
                return false;
            nSize = *pc++;
        }
        else if (opcode == OP_PUSHDATA2)
        {
            if (end - pc < 2)
                return false;
            nSize = ReadLE16(&pc[0]);
            pc += 2;
        }
        else if (opcode == OP_PUSHDATA4)
        {
            if (end - pc < 4)
                return false;
            nSize = ReadLE32(&pc[0]);
            pc += 4;
        }
        if (end - pc < 0 || (unsigned int)(end - pc) < nSize)
            return false;
        if (pvchRet)
            pvchRet->assign(pc, pc + nSize);
        pc += nSize;
    }

    opcodeRet = static_cast<opcodetype>(opcode);
    return true;
}